

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError MuxImagePush(WebPMuxImage *wpi,WebPMuxImage **wpi_list)

{
  WebPChunk *pWVar1;
  WebPChunk *pWVar2;
  WebPChunk *pWVar3;
  WebPChunk *pWVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  WebPMuxError WVar8;
  WebPMuxImage *cur_wpi;
  WebPMuxImage *pWVar9;
  WebPMuxImage **ppWVar10;
  WebPMuxImage **ppWVar11;
  
  do {
    ppWVar11 = wpi_list;
    pWVar9 = *ppWVar11;
    if (pWVar9 == (WebPMuxImage *)0x0) break;
    wpi_list = &pWVar9->next;
  } while (pWVar9->next != (WebPMuxImage *)0x0);
  pWVar9 = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
  if (pWVar9 == (WebPMuxImage *)0x0) {
    WVar8 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    pWVar9->next = wpi->next;
    pWVar1 = wpi->header;
    pWVar2 = wpi->alpha;
    pWVar3 = wpi->img;
    pWVar4 = wpi->unknown;
    iVar5 = wpi->height;
    iVar6 = wpi->has_alpha;
    iVar7 = wpi->is_partial;
    pWVar9->width = wpi->width;
    pWVar9->height = iVar5;
    pWVar9->has_alpha = iVar6;
    pWVar9->is_partial = iVar7;
    pWVar9->img = pWVar3;
    pWVar9->unknown = pWVar4;
    pWVar9->header = pWVar1;
    pWVar9->alpha = pWVar2;
    pWVar9->next = (WebPMuxImage *)0x0;
    ppWVar10 = &(*ppWVar11)->next;
    if (*ppWVar11 == (WebPMuxImage *)0x0) {
      ppWVar10 = ppWVar11;
    }
    *ppWVar10 = pWVar9;
    WVar8 = WEBP_MUX_OK;
  }
  return WVar8;
}

Assistant:

WebPMuxError MuxImagePush(const WebPMuxImage* wpi, WebPMuxImage** wpi_list) {
  WebPMuxImage* new_wpi;

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    if (cur_wpi->next == NULL) break;
    wpi_list = &cur_wpi->next;
  }

  new_wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*new_wpi));
  if (new_wpi == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_wpi = *wpi;
  new_wpi->next = NULL;

  if (*wpi_list != NULL) {
    (*wpi_list)->next = new_wpi;
  } else {
    *wpi_list = new_wpi;
  }
  return WEBP_MUX_OK;
}